

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_interface.c
# Opt level: O3

void * print_new(t_symbol *sel,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  t_pd *pp_Var2;
  t_symbol *ptVar3;
  _binbuf *x;
  t_pd p_Var4;
  int bufsize;
  char *buf;
  int local_34;
  char *local_30;
  
  pp_Var2 = pd_new(print_class);
  if (argc == 1) {
    if (argv->a_type != A_SYMBOL) goto LAB_001828c0;
    ptVar3 = atom_getsymbolarg(0,1,argv);
    ptVar1 = ((t_pd)ptVar3)->c_name;
    if (((*(char *)&ptVar1->s_name == '-') && (*(char *)((long)&ptVar1->s_name + 1) == 'n')) &&
       (*(char *)((long)&ptVar1->s_name + 2) == '\0')) {
      ptVar3 = &s_;
    }
  }
  else {
    if (argc != 0) {
LAB_001828c0:
      x = binbuf_new();
      binbuf_add(x,argc,argv);
      binbuf_gettext(x,&local_30,&local_34);
      local_30 = (char *)resizebytes(local_30,(long)local_34,(long)local_34 + 1);
      local_30[local_34] = '\0';
      p_Var4 = (t_pd)gensym(local_30);
      pp_Var2[6] = p_Var4;
      freebytes(local_30,(long)local_34 + 1);
      binbuf_free(x);
      return pp_Var2;
    }
    ptVar3 = gensym("print");
  }
  pp_Var2[6] = (t_pd)ptVar3;
  return pp_Var2;
}

Assistant:

static void *print_new(t_symbol *sel, int argc, t_atom *argv)
{
    t_print *x = (t_print *)pd_new(print_class);
    if (argc == 0)
        x->x_sym = gensym("print");
    else if (argc == 1 && argv->a_type == A_SYMBOL)
    {
        t_symbol *s = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(s->s_name, "-n"))
            x->x_sym = &s_;
        else x->x_sym = s;
    }
    else
    {
        int bufsize;
        char *buf;
        t_binbuf *bb = binbuf_new();
        binbuf_add(bb, argc, argv);
        binbuf_gettext(bb, &buf, &bufsize);
        buf = resizebytes(buf, bufsize, bufsize+1);
        buf[bufsize] = 0;
        x->x_sym = gensym(buf);
        freebytes(buf, bufsize+1);
        binbuf_free(bb);
    }
    return (x);
}